

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

TextMarkerGenerator * google::protobuf::TextMarkerGenerator::CreateRandom(void)

{
  size_t sVar1;
  char *pcVar2;
  result_type rVar3;
  result_type __n;
  TextMarkerGenerator *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  Time t;
  Time TVar5;
  mt19937_64 random;
  uniform_int_distribution<unsigned_long> local_9f8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_9e8;
  
  TVar5 = absl::lts_20250127::Now();
  t.rep_.rep_lo_ = TVar5.rep_.rep_lo_;
  t.rep_.rep_hi_.hi_ = 0;
  t.rep_.rep_hi_.lo_ = t.rep_.rep_lo_;
  rVar3 = absl::lts_20250127::ToUnixMicros((lts_20250127 *)TVar5.rep_.rep_hi_,t);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&local_9e8,rVar3);
  local_9f8._M_param._M_a = 0;
  local_9f8._M_param._M_b = 2;
  rVar3 = std::uniform_int_distribution<unsigned_long>::operator()(&local_9f8,&local_9e8);
  local_9f8._M_param._M_a = 1;
  local_9f8._M_param._M_b = 3;
  __n = std::uniform_int_distribution<unsigned_long>::operator()(&local_9f8,&local_9e8);
  sVar1 = kRedactionMarkers[rVar3]._M_len;
  pcVar2 = kRedactionMarkers[rVar3]._M_str;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&kRandomMarker,0,__n);
  (in_RDI->redaction_marker_)._M_len = sVar1;
  (in_RDI->redaction_marker_)._M_str = pcVar2;
  (in_RDI->random_marker_)._M_len = bVar4._M_len;
  (in_RDI->random_marker_)._M_str = bVar4._M_str;
  return in_RDI;
}

Assistant:

TextMarkerGenerator TextMarkerGenerator::CreateRandom() {
  // We avoid using sources backed by system entropy to allow the marker
  // generator to work in sandboxed environments that have no access to syscalls
  // such as getrandom or getpid. Note that this randomization has no security
  // implications, it's only used to break code that attempts to deserialize
  // debug strings.
  std::mt19937_64 random{
      static_cast<uint64_t>(absl::ToUnixMicros(absl::Now()))};

  size_t redaction_marker_index = std::uniform_int_distribution<size_t>{
      0, ABSL_ARRAYSIZE(kRedactionMarkers) - 1}(random);

  size_t random_marker_size =
      std::uniform_int_distribution<size_t>{1, kRandomMarker.size()}(random);

  return TextMarkerGenerator(kRedactionMarkers[redaction_marker_index],
                             kRandomMarker.substr(0, random_marker_size));
}